

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_comp.cpp
# Opt level: O2

bool __thiscall
basisu::basis_compressor::write_output_files_and_compute_stats(basis_compressor *this)

{
  uint32_t uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  size_t __n;
  vector<basisu::image> *pvVar8;
  vector<basisu::image> *pvVar9;
  bool bVar10;
  int iVar11;
  uchar *puVar12;
  void *pSrc_buf;
  void *__s1;
  basisu_backend_slice_desc *pbVar13;
  image_stats *piVar14;
  image *piVar15;
  image *piVar16;
  size_t sVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  gpu_image *pgVar19;
  bool bVar20;
  basis_compressor *pbVar21;
  vector<unsigned_char> *v;
  uint uVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar23;
  uint32_t i;
  ulong uVar24;
  image best_etc1s_unpacked;
  size_t decomp_size;
  float fStack_110;
  float fStack_10c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  unsigned_long *local_f8;
  basis_compressor *local_e8;
  vector<basisu::image> *local_e0;
  vector<basisu::image> *local_d8;
  size_t comp_size;
  float local_c4;
  string out_basename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  vector<basisu::gpu_image> *local_80;
  vector<basisu::image> *local_78;
  vector<unsigned_char> *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_68
  ;
  vector<basisu::gpu_image> *local_60;
  vector<basisu::image> *local_58;
  vector<basisu::gpu_image> *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  vector<basisu::image_stats> *local_40;
  vector<basisu::basisu_backend_slice_desc> *local_38;
  
  debug_printf("basis_compressor::write_output_files_and_compute_stats\n");
  bVar20 = (this->m_params).m_create_ktx2_file.m_value;
  v = (vector<unsigned_char> *)((long)&(this->m_basis_file).m_header + (ulong)bVar20 * 0x80 + 0x60);
  if ((this->m_params).m_write_output_basis_files.m_value == true) {
    bVar10 = write_vec_to_file((this->m_params).m_out_filename._M_dataplus._M_p,v);
    if (!bVar10) {
      error_printf("Failed writing output data to file \"%s\"\n",
                   (this->m_params).m_out_filename._M_dataplus._M_p);
      return false;
    }
    if ((this->m_params).m_status_output.m_value == true) {
      printf("Wrote output .basis/.ktx2 file \"%s\"\n");
    }
  }
  comp_size = 0;
  if ((((this->m_params).m_compute_stats.m_value == true) &&
      ((this->m_params).m_uastc.m_value == true)) &&
     (*(int *)((long)&(this->m_basis_file).m_header + (ulong)bVar20 * 0x80 + 0x68) != 0)) {
    puVar12 = vector<unsigned_char>::operator[](v,0);
    pSrc_buf = buminiz::tdefl_compress_mem_to_heap
                         (puVar12,(ulong)*(uint *)((long)&(this->m_basis_file).m_header +
                                                  (ulong)bVar20 * 0x80 + 0x68),&comp_size,0xfff);
    decomp_size._0_4_ = 0;
    decomp_size._4_4_ = 0;
    __s1 = buminiz::tinfl_decompress_mem_to_heap(pSrc_buf,comp_size,&decomp_size,0);
    __n = CONCAT44(decomp_size._4_4_,(undefined4)decomp_size);
    if (__n == *(uint *)((long)&(this->m_basis_file).m_header + (ulong)bVar20 * 0x80 + 0x68)) {
      uVar22 = 0;
      puVar12 = vector<unsigned_char>::operator[](v,0);
      iVar11 = bcmp(__s1,puVar12,__n);
      if (iVar11 == 0) {
        free(pSrc_buf);
        free(__s1);
        for (uVar24 = 0; uVar24 < (this->m_slice_descs).m_size; uVar24 = uVar24 + 1) {
          pbVar13 = vector<basisu::basisu_backend_slice_desc>::operator[]
                              (&this->m_slice_descs,uVar24);
          uVar1 = pbVar13->m_num_blocks_x;
          pbVar13 = vector<basisu::basisu_backend_slice_desc>::operator[]
                              (&this->m_slice_descs,uVar24);
          uVar22 = uVar22 + uVar1 * pbVar13->m_num_blocks_y * 0x10;
        }
        this->m_basis_bits_per_texel = (double)(((float)comp_size * 8.0) / (float)uVar22);
        debug_printf(".basis file size: %u, LZ compressed file size: %u, %3.2f bits/texel\n",
                     (ulong)*(uint *)((long)&(this->m_basis_file).m_header +
                                     (ulong)bVar20 * 0x80 + 0x68));
        goto LAB_00216b55;
      }
    }
    puts(
        "basis_compressor::create_basis_file_and_transcode:: miniz compression or decompression failed!"
        );
    bVar20 = false;
  }
  else {
LAB_00216b55:
    local_40 = &this->m_stats;
    vector<basisu::image_stats>::resize(local_40,(ulong)(this->m_slice_descs).m_size,false);
    bVar20 = true;
    if ((this->m_params).m_validate_output_data.m_value == true) {
      local_38 = &this->m_slice_descs;
      local_d8 = &this->m_slice_images;
      local_e0 = &this->m_decoded_output_textures_unpacked;
      local_78 = &this->m_decoded_output_textures_unpacked_bc7;
      local_58 = &this->m_best_etc1s_images_unpacked;
      pbVar23 = &(this->m_params).m_out_filename;
      local_68 = &(this->m_params).m_source_filenames;
      local_60 = &this->m_best_etc1s_images;
      local_50 = &this->m_decoded_output_textures;
      local_80 = &this->m_decoded_output_textures_bc7;
      local_e8 = this;
      local_70 = v;
      local_48 = pbVar23;
      for (uVar24 = 0; uVar24 < (this->m_slice_descs).m_size; uVar24 = uVar24 + 1) {
        pbVar13 = vector<basisu::basisu_backend_slice_desc>::operator[](local_38,uVar24);
        if ((this->m_params).m_compute_stats.m_value == true) {
          printf("Slice: %u\n",uVar24 & 0xffffffff);
          piVar14 = vector<basisu::image_stats>::operator[](local_40,uVar24);
          pvVar8 = local_d8;
          decomp_size._0_4_ = 0;
          decomp_size._4_4_ = 0;
          fStack_110 = 0.0;
          fStack_10c = 0.0;
          local_108._M_allocated_capacity = 0;
          piVar15 = vector<basisu::image>::operator[](local_d8,uVar24);
          piVar16 = vector<basisu::image>::operator[](local_e0,uVar24);
          image_metrics::calc((image_metrics *)&decomp_size,piVar15,piVar16,0,3,true,false);
          image_metrics::print((image_metrics *)&decomp_size,".basis RGB Avg:          ");
          piVar14->m_basis_rgb_avg_psnr = (float)local_108._M_allocated_capacity._0_4_;
          piVar15 = vector<basisu::image>::operator[](pvVar8,uVar24);
          pvVar8 = local_e0;
          piVar16 = vector<basisu::image>::operator[](local_e0,uVar24);
          image_metrics::calc((image_metrics *)&decomp_size,piVar15,piVar16,0,4,true,false);
          image_metrics::print((image_metrics *)&decomp_size,".basis RGBA Avg:         ");
          pvVar9 = local_d8;
          piVar14->m_basis_rgba_avg_psnr = (float)local_108._M_allocated_capacity._0_4_;
          piVar15 = vector<basisu::image>::operator[](local_d8,uVar24);
          piVar16 = vector<basisu::image>::operator[](pvVar8,uVar24);
          image_metrics::calc((image_metrics *)&decomp_size,piVar15,piVar16,0,1,true,false);
          image_metrics::print((image_metrics *)&decomp_size,".basis R   Avg:          ");
          piVar15 = vector<basisu::image>::operator[](pvVar9,uVar24);
          piVar16 = vector<basisu::image>::operator[](pvVar8,uVar24);
          image_metrics::calc((image_metrics *)&decomp_size,piVar15,piVar16,1,1,true,false);
          image_metrics::print((image_metrics *)&decomp_size,".basis G   Avg:          ");
          piVar15 = vector<basisu::image>::operator[](pvVar9,uVar24);
          piVar16 = vector<basisu::image>::operator[](pvVar8,uVar24);
          image_metrics::calc((image_metrics *)&decomp_size,piVar15,piVar16,2,1,true,false);
          image_metrics::print((image_metrics *)&decomp_size,".basis B   Avg:          ");
          if ((local_e8->m_params).m_uastc.m_value == true) {
            piVar15 = vector<basisu::image>::operator[](pvVar9,uVar24);
            piVar16 = vector<basisu::image>::operator[](pvVar8,uVar24);
            image_metrics::calc((image_metrics *)&decomp_size,piVar15,piVar16,3,1,true,false);
            image_metrics::print((image_metrics *)&decomp_size,".basis A   Avg:          ");
            piVar14->m_basis_a_avg_psnr = (float)local_108._M_allocated_capacity._0_4_;
          }
          piVar15 = vector<basisu::image>::operator[](pvVar9,uVar24);
          piVar16 = vector<basisu::image>::operator[](pvVar8,uVar24);
          image_metrics::calc((image_metrics *)&decomp_size,piVar15,piVar16,0,0,true,false);
          image_metrics::print((image_metrics *)&decomp_size,".basis 709 Luma:         ");
          piVar14->m_basis_luma_709_psnr = (float)local_108._M_allocated_capacity._0_4_;
          piVar14->m_basis_luma_709_ssim = (float)local_108._M_allocated_capacity._4_4_;
          piVar15 = vector<basisu::image>::operator[](pvVar9,uVar24);
          piVar16 = vector<basisu::image>::operator[](pvVar8,uVar24);
          image_metrics::calc((image_metrics *)&decomp_size,piVar15,piVar16,0,0,true,true);
          image_metrics::print((image_metrics *)&decomp_size,".basis 601 Luma:         ");
          pvVar8 = local_78;
          pbVar21 = local_e8;
          piVar14->m_basis_luma_601_psnr = (float)local_108._M_allocated_capacity._0_4_;
          if ((local_e8->m_slice_descs).m_size == 1) {
            sVar17 = comp_size;
            if (comp_size == 0) {
              sVar17 = (size_t)local_70->m_size;
            }
            local_c4 = (float)(sVar17 & 0xffffffff) * 8.0;
            debug_printf(".basis RGB PSNR per bit/texel*10000: %3.3f\n",
                         SUB84((double)((piVar14->m_basis_rgb_avg_psnr * 10000.0) /
                                       (local_c4 /
                                       (float)(pbVar13->m_orig_height * pbVar13->m_orig_width))),0))
            ;
            debug_printf(".basis Luma 709 PSNR per bit/texel*10000: %3.3f\n",
                         SUB84((double)((piVar14->m_basis_luma_709_psnr * 10000.0) /
                                       (local_c4 /
                                       (float)(pbVar13->m_orig_height * pbVar13->m_orig_width))),0))
            ;
          }
          piVar15 = vector<basisu::image>::operator[](pvVar8,uVar24);
          pvVar9 = local_d8;
          if (piVar15->m_width != 0) {
            piVar15 = vector<basisu::image>::operator[](local_d8,uVar24);
            piVar16 = vector<basisu::image>::operator[](pvVar8,uVar24);
            image_metrics::calc((image_metrics *)&decomp_size,piVar15,piVar16,0,3,true,false);
            image_metrics::print((image_metrics *)&decomp_size,"BC7 RGB Avg:             ");
            piVar14->m_bc7_rgb_avg_psnr = (float)local_108._M_allocated_capacity._0_4_;
            piVar15 = vector<basisu::image>::operator[](pvVar9,uVar24);
            piVar16 = vector<basisu::image>::operator[](pvVar8,uVar24);
            image_metrics::calc((image_metrics *)&decomp_size,piVar15,piVar16,0,4,true,false);
            image_metrics::print((image_metrics *)&decomp_size,"BC7 RGBA Avg:            ");
            piVar14->m_bc7_rgba_avg_psnr = (float)local_108._M_allocated_capacity._0_4_;
            piVar15 = vector<basisu::image>::operator[](pvVar9,uVar24);
            piVar16 = vector<basisu::image>::operator[](pvVar8,uVar24);
            image_metrics::calc((image_metrics *)&decomp_size,piVar15,piVar16,0,1,true,false);
            image_metrics::print((image_metrics *)&decomp_size,"BC7 R   Avg:             ");
            piVar15 = vector<basisu::image>::operator[](pvVar9,uVar24);
            piVar16 = vector<basisu::image>::operator[](pvVar8,uVar24);
            image_metrics::calc((image_metrics *)&decomp_size,piVar15,piVar16,1,1,true,false);
            image_metrics::print((image_metrics *)&decomp_size,"BC7 G   Avg:             ");
            piVar15 = vector<basisu::image>::operator[](pvVar9,uVar24);
            piVar16 = vector<basisu::image>::operator[](pvVar8,uVar24);
            image_metrics::calc((image_metrics *)&decomp_size,piVar15,piVar16,2,1,true,false);
            image_metrics::print((image_metrics *)&decomp_size,"BC7 B   Avg:             ");
            if ((local_e8->m_params).m_uastc.m_value == true) {
              piVar15 = vector<basisu::image>::operator[](pvVar9,uVar24);
              piVar16 = vector<basisu::image>::operator[](pvVar8,uVar24);
              image_metrics::calc((image_metrics *)&decomp_size,piVar15,piVar16,3,1,true,false);
              image_metrics::print((image_metrics *)&decomp_size,"BC7 A   Avg:             ");
              piVar14->m_bc7_a_avg_psnr = (float)local_108._M_allocated_capacity._0_4_;
            }
            piVar15 = vector<basisu::image>::operator[](pvVar9,uVar24);
            piVar16 = vector<basisu::image>::operator[](pvVar8,uVar24);
            image_metrics::calc((image_metrics *)&decomp_size,piVar15,piVar16,0,0,true,false);
            image_metrics::print((image_metrics *)&decomp_size,"BC7 709 Luma:            ");
            piVar14->m_bc7_luma_709_psnr = (float)local_108._M_allocated_capacity._0_4_;
            piVar14->m_bc7_luma_709_ssim = (float)local_108._M_allocated_capacity._4_4_;
            piVar15 = vector<basisu::image>::operator[](pvVar9,uVar24);
            piVar16 = vector<basisu::image>::operator[](pvVar8,uVar24);
            image_metrics::calc((image_metrics *)&decomp_size,piVar15,piVar16,0,0,true,true);
            image_metrics::print((image_metrics *)&decomp_size,"BC7 601 Luma:            ");
            piVar14->m_bc7_luma_601_psnr = (float)local_108._M_allocated_capacity._0_4_;
            pbVar21 = local_e8;
          }
          this = local_e8;
          pbVar23 = local_48;
          if ((pbVar21->m_params).m_uastc.m_value == false) {
            piVar15 = vector<basisu::image>::operator[](pvVar9,uVar24);
            pvVar8 = local_58;
            piVar16 = vector<basisu::image>::operator[](local_58,uVar24);
            image_metrics::calc((image_metrics *)&decomp_size,piVar15,piVar16,0,3,true,false);
            image_metrics::print((image_metrics *)&decomp_size,"Unquantized ETC1S RGB Avg:     ");
            piVar14->m_best_etc1s_rgb_avg_psnr = (float)local_108._M_allocated_capacity._0_4_;
            piVar15 = vector<basisu::image>::operator[](pvVar9,uVar24);
            piVar16 = vector<basisu::image>::operator[](pvVar8,uVar24);
            image_metrics::calc((image_metrics *)&decomp_size,piVar15,piVar16,0,0,true,false);
            image_metrics::print((image_metrics *)&decomp_size,"Unquantized ETC1S 709 Luma:    ");
            piVar14->m_best_etc1s_luma_709_psnr = (float)local_108._M_allocated_capacity._0_4_;
            piVar14->m_best_etc1s_luma_709_ssim = (float)local_108._M_allocated_capacity._4_4_;
            piVar15 = vector<basisu::image>::operator[](pvVar9,uVar24);
            piVar16 = vector<basisu::image>::operator[](pvVar8,uVar24);
            image_metrics::calc((image_metrics *)&decomp_size,piVar15,piVar16,0,0,true,true);
            image_metrics::print((image_metrics *)&decomp_size,"Unquantized ETC1S 601 Luma:    ");
            piVar14->m_best_etc1s_luma_601_psnr = (float)local_108._M_allocated_capacity._0_4_;
            this = local_e8;
            pbVar23 = local_48;
          }
        }
        out_basename._M_dataplus._M_p = (pointer)&out_basename.field_2;
        out_basename._M_string_length = 0;
        out_basename.field_2._M_local_buf[0] = '\0';
        pbVar18 = pbVar23;
        if ((this->m_params).m_out_filename._M_string_length == 0) {
          if ((this->m_params).m_source_filenames.m_size != 0) {
            pbVar18 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator[](local_68,(ulong)pbVar13->m_source_file_index);
            goto LAB_0021742f;
          }
        }
        else {
LAB_0021742f:
          string_get_filename((pbVar18->_M_dataplus)._M_p,&out_basename);
        }
        string_remove_extension(&out_basename);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &best_etc1s_unpacked,"basis_debug_",&out_basename);
        string_format_abi_cxx11_(&local_a0,"_slice_%u",uVar24 & 0xffffffff);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &decomp_size,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &best_etc1s_unpacked,&local_a0);
        std::__cxx11::string::operator=((string *)&out_basename,(string *)&decomp_size);
        std::__cxx11::string::~string((string *)&decomp_size);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&best_etc1s_unpacked);
        if (((this->m_params).m_uastc.m_value == false) &&
           ((this->m_frontend).m_params.m_debug_images == true)) {
          pgVar19 = vector<basisu::gpu_image>::operator[](local_60,uVar24);
          gpu_image::gpu_image((gpu_image *)&decomp_size,pgVar19);
          uVar2 = pbVar13->m_orig_width;
          uVar5 = pbVar13->m_orig_height;
          decomp_size._4_4_ = uVar2;
          fStack_110 = (float)uVar5;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &best_etc1s_unpacked,&out_basename,"_best_etc1s.ktx");
          write_compressed_texture_file((char *)best_etc1s_unpacked._0_8_,(gpu_image *)&decomp_size)
          ;
          std::__cxx11::string::~string((string *)&best_etc1s_unpacked);
          best_etc1s_unpacked.m_width = 0;
          best_etc1s_unpacked.m_height = 0;
          best_etc1s_unpacked.m_pitch = 0;
          best_etc1s_unpacked.m_pixels.m_p = (color_rgba *)0x0;
          best_etc1s_unpacked.m_pixels.m_size = 0;
          best_etc1s_unpacked.m_pixels.m_capacity = 0;
          gpu_image::unpack((gpu_image *)&decomp_size,&best_etc1s_unpacked);
          std::operator+(&local_a0,&out_basename,"_best_etc1s.png");
          save_png(local_a0._M_dataplus._M_p,&best_etc1s_unpacked,0,0);
          std::__cxx11::string::~string((string *)&local_a0);
          free(best_etc1s_unpacked.m_pixels.m_p);
          free(local_f8);
        }
        if ((this->m_params).m_debug_images.m_value == true) {
          pgVar19 = vector<basisu::gpu_image>::operator[](local_50,uVar24);
          gpu_image::gpu_image((gpu_image *)&decomp_size,pgVar19);
          uVar3 = pbVar13->m_orig_width;
          uVar6 = pbVar13->m_orig_height;
          decomp_size._4_4_ = uVar3;
          fStack_110 = (float)uVar6;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &best_etc1s_unpacked,&out_basename,"_transcoded_etc1s_or_astc.ktx");
          write_compressed_texture_file((char *)best_etc1s_unpacked._0_8_,(gpu_image *)&decomp_size)
          ;
          std::__cxx11::string::~string((string *)&best_etc1s_unpacked);
          piVar15 = vector<basisu::image>::operator[](local_e0,uVar24);
          image::image(&best_etc1s_unpacked,piVar15);
          image::crop(&best_etc1s_unpacked,pbVar13->m_orig_width,pbVar13->m_orig_height,0xffffffff,
                      (color_rgba *)&g_black_color,true);
          std::operator+(&local_a0,&out_basename,"_transcoded_etc1s_or_astc.png");
          save_png(local_a0._M_dataplus._M_p,&best_etc1s_unpacked,0,0);
          std::__cxx11::string::~string((string *)&local_a0);
          free(best_etc1s_unpacked.m_pixels.m_p);
          free(local_f8);
          pgVar19 = vector<basisu::gpu_image>::operator[](local_80,uVar24);
          if (pgVar19->m_width != 0) {
            pgVar19 = vector<basisu::gpu_image>::operator[](local_80,uVar24);
            gpu_image::gpu_image((gpu_image *)&decomp_size,pgVar19);
            uVar4 = pbVar13->m_orig_width;
            uVar7 = pbVar13->m_orig_height;
            decomp_size._4_4_ = uVar4;
            fStack_110 = (float)uVar7;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &best_etc1s_unpacked,&out_basename,"_transcoded_bc7.ktx");
            write_compressed_texture_file
                      ((char *)best_etc1s_unpacked._0_8_,(gpu_image *)&decomp_size);
            std::__cxx11::string::~string((string *)&best_etc1s_unpacked);
            piVar15 = vector<basisu::image>::operator[](local_78,uVar24);
            image::image(&best_etc1s_unpacked,piVar15);
            image::crop(&best_etc1s_unpacked,pbVar13->m_orig_width,pbVar13->m_orig_height,0xffffffff
                        ,(color_rgba *)&g_black_color,true);
            std::operator+(&local_a0,&out_basename,"_transcoded_bc7.png");
            save_png(local_a0._M_dataplus._M_p,&best_etc1s_unpacked,0,0);
            std::__cxx11::string::~string((string *)&local_a0);
            free(best_etc1s_unpacked.m_pixels.m_p);
            free(local_f8);
          }
        }
        std::__cxx11::string::~string((string *)&out_basename);
      }
      bVar20 = true;
    }
  }
  return bVar20;
}

Assistant:

bool basis_compressor::write_output_files_and_compute_stats()
	{
		debug_printf("basis_compressor::write_output_files_and_compute_stats\n");

		const uint8_vec& comp_data = m_params.m_create_ktx2_file ? m_output_ktx2_file : m_basis_file.get_compressed_data();
		if (m_params.m_write_output_basis_files)
		{
			const std::string& output_filename = m_params.m_out_filename;

			if (!write_vec_to_file(output_filename.c_str(), comp_data))
			{
				error_printf("Failed writing output data to file \"%s\"\n", output_filename.c_str());
				return false;
			}

			if (m_params.m_status_output)
			{
				printf("Wrote output .basis/.ktx2 file \"%s\"\n", output_filename.c_str());
			}
		}

		size_t comp_size = 0;
		if ((m_params.m_compute_stats) && (m_params.m_uastc) && (comp_data.size()))
		{
			void* pComp_data = tdefl_compress_mem_to_heap(&comp_data[0], comp_data.size(), &comp_size, TDEFL_MAX_PROBES_MASK);// TDEFL_DEFAULT_MAX_PROBES);
			size_t decomp_size = 0;
			void* pDecomp_data = tinfl_decompress_mem_to_heap(pComp_data, comp_size, &decomp_size, 0);
			if ((decomp_size != comp_data.size()) || (memcmp(pDecomp_data, &comp_data[0], decomp_size) != 0))
			{
				printf("basis_compressor::create_basis_file_and_transcode:: miniz compression or decompression failed!\n");
				return false;
			}

			mz_free(pComp_data);
			mz_free(pDecomp_data);

			uint32_t total_texels = 0;
			for (uint32_t i = 0; i < m_slice_descs.size(); i++)
				total_texels += (m_slice_descs[i].m_num_blocks_x * m_slice_descs[i].m_num_blocks_y) * 16;
			
			m_basis_bits_per_texel = comp_size * 8.0f / total_texels;

			debug_printf(".basis file size: %u, LZ compressed file size: %u, %3.2f bits/texel\n",
				(uint32_t)comp_data.size(),
				(uint32_t)comp_size,
				m_basis_bits_per_texel);
		}

		m_stats.resize(m_slice_descs.size());
		
		if (m_params.m_validate_output_data)
		{
			for (uint32_t slice_index = 0; slice_index < m_slice_descs.size(); slice_index++)
			{
				const basisu_backend_slice_desc& slice_desc = m_slice_descs[slice_index];

				if (m_params.m_compute_stats)
				{
					printf("Slice: %u\n", slice_index);

					image_stats& s = m_stats[slice_index];

					// TODO: We used to output SSIM (during heavy encoder development), but this slowed down compression too much. We'll be adding it back.

					image_metrics em;

					// ---- .basis stats
					em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked[slice_index], 0, 3);
					em.print(".basis RGB Avg:          ");
					s.m_basis_rgb_avg_psnr = em.m_psnr;

					em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked[slice_index], 0, 4);
					em.print(".basis RGBA Avg:         ");
					s.m_basis_rgba_avg_psnr = em.m_psnr;

					em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked[slice_index], 0, 1);
					em.print(".basis R   Avg:          ");

					em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked[slice_index], 1, 1);
					em.print(".basis G   Avg:          ");

					em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked[slice_index], 2, 1);
					em.print(".basis B   Avg:          ");

					if (m_params.m_uastc)
					{
						em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked[slice_index], 3, 1);
						em.print(".basis A   Avg:          ");

						s.m_basis_a_avg_psnr = em.m_psnr;
					}

					em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked[slice_index], 0, 0);
					em.print(".basis 709 Luma:         ");
					s.m_basis_luma_709_psnr = static_cast<float>(em.m_psnr);
					s.m_basis_luma_709_ssim = static_cast<float>(em.m_ssim);

					em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked[slice_index], 0, 0, true, true);
					em.print(".basis 601 Luma:         ");
					s.m_basis_luma_601_psnr = static_cast<float>(em.m_psnr);

					if (m_slice_descs.size() == 1)
					{
						const uint32_t output_size = comp_size ? (uint32_t)comp_size : (uint32_t)comp_data.size();
						debug_printf(".basis RGB PSNR per bit/texel*10000: %3.3f\n", 10000.0f * s.m_basis_rgb_avg_psnr / ((output_size * 8.0f) / (slice_desc.m_orig_width * slice_desc.m_orig_height)));
						debug_printf(".basis Luma 709 PSNR per bit/texel*10000: %3.3f\n", 10000.0f * s.m_basis_luma_709_psnr / ((output_size * 8.0f) / (slice_desc.m_orig_width * slice_desc.m_orig_height)));
					}

					if (m_decoded_output_textures_unpacked_bc7[slice_index].get_width())
					{
						// ---- BC7 stats
						em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked_bc7[slice_index], 0, 3);
						em.print("BC7 RGB Avg:             ");
						s.m_bc7_rgb_avg_psnr = em.m_psnr;

						em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked_bc7[slice_index], 0, 4);
						em.print("BC7 RGBA Avg:            ");
						s.m_bc7_rgba_avg_psnr = em.m_psnr;

						em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked_bc7[slice_index], 0, 1);
						em.print("BC7 R   Avg:             ");

						em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked_bc7[slice_index], 1, 1);
						em.print("BC7 G   Avg:             ");

						em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked_bc7[slice_index], 2, 1);
						em.print("BC7 B   Avg:             ");

						if (m_params.m_uastc)
						{
							em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked_bc7[slice_index], 3, 1);
							em.print("BC7 A   Avg:             ");

							s.m_bc7_a_avg_psnr = em.m_psnr;
						}

						em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked_bc7[slice_index], 0, 0);
						em.print("BC7 709 Luma:            ");
						s.m_bc7_luma_709_psnr = static_cast<float>(em.m_psnr);
						s.m_bc7_luma_709_ssim = static_cast<float>(em.m_ssim);

						em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked_bc7[slice_index], 0, 0, true, true);
						em.print("BC7 601 Luma:            ");
						s.m_bc7_luma_601_psnr = static_cast<float>(em.m_psnr);
					}

					if (!m_params.m_uastc)
					{
						// ---- Nearly best possible ETC1S stats
						em.calc(m_slice_images[slice_index], m_best_etc1s_images_unpacked[slice_index], 0, 3);
						em.print("Unquantized ETC1S RGB Avg:     ");
						s.m_best_etc1s_rgb_avg_psnr = static_cast<float>(em.m_psnr);

						em.calc(m_slice_images[slice_index], m_best_etc1s_images_unpacked[slice_index], 0, 0);
						em.print("Unquantized ETC1S 709 Luma:    ");
						s.m_best_etc1s_luma_709_psnr = static_cast<float>(em.m_psnr);
						s.m_best_etc1s_luma_709_ssim = static_cast<float>(em.m_ssim);

						em.calc(m_slice_images[slice_index], m_best_etc1s_images_unpacked[slice_index], 0, 0, true, true);
						em.print("Unquantized ETC1S 601 Luma:    ");
						s.m_best_etc1s_luma_601_psnr = static_cast<float>(em.m_psnr);
					}
				}

				std::string out_basename;
				if (m_params.m_out_filename.size())
					string_get_filename(m_params.m_out_filename.c_str(), out_basename);
				else if (m_params.m_source_filenames.size())
					string_get_filename(m_params.m_source_filenames[slice_desc.m_source_file_index].c_str(), out_basename);

				string_remove_extension(out_basename);
				out_basename = "basis_debug_" + out_basename + string_format("_slice_%u", slice_index);

				if ((!m_params.m_uastc) && (m_frontend.get_params().m_debug_images))
				{
					// Write "best" ETC1S debug images
					if (!m_params.m_uastc)
					{
						gpu_image best_etc1s_gpu_image(m_best_etc1s_images[slice_index]);
						best_etc1s_gpu_image.override_dimensions(slice_desc.m_orig_width, slice_desc.m_orig_height);
						write_compressed_texture_file((out_basename + "_best_etc1s.ktx").c_str(), best_etc1s_gpu_image);

						image best_etc1s_unpacked;
						best_etc1s_gpu_image.unpack(best_etc1s_unpacked);
						save_png(out_basename + "_best_etc1s.png", best_etc1s_unpacked);
					}
				}

				if (m_params.m_debug_images)
				{
					// Write decoded ETC1S/ASTC debug images
					{
						gpu_image decoded_etc1s_or_astc(m_decoded_output_textures[slice_index]);
						decoded_etc1s_or_astc.override_dimensions(slice_desc.m_orig_width, slice_desc.m_orig_height);
						write_compressed_texture_file((out_basename + "_transcoded_etc1s_or_astc.ktx").c_str(), decoded_etc1s_or_astc);

						image temp(m_decoded_output_textures_unpacked[slice_index]);
						temp.crop(slice_desc.m_orig_width, slice_desc.m_orig_height);
						save_png(out_basename + "_transcoded_etc1s_or_astc.png", temp);
					}

					// Write decoded BC7 debug images
					if (m_decoded_output_textures_bc7[slice_index].get_pixel_width())
					{
						gpu_image decoded_bc7(m_decoded_output_textures_bc7[slice_index]);
						decoded_bc7.override_dimensions(slice_desc.m_orig_width, slice_desc.m_orig_height);
						write_compressed_texture_file((out_basename + "_transcoded_bc7.ktx").c_str(), decoded_bc7);

						image temp(m_decoded_output_textures_unpacked_bc7[slice_index]);
						temp.crop(slice_desc.m_orig_width, slice_desc.m_orig_height);
						save_png(out_basename + "_transcoded_bc7.png", temp);
					}
				}
			}
		} // if (m_params.m_validate_output_data)
				
		return true;
	}